

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_post_demo.c
# Opt level: O0

int file_upload_cb(void *data,char *name,char *filename,char *buf,int len,
                  lws_spa_fileupload_states state)

{
  int iVar1;
  ulong uVar2;
  int n;
  per_session_data__post_demo *pss;
  lws_spa_fileupload_states state_local;
  int len_local;
  char *buf_local;
  char *filename_local;
  char *name_local;
  void *data_local;
  
  if (state < LWS_UFS_OPEN) {
    if (len != 0) {
      *(long *)((long)data + 0x858) = (long)len + *(long *)((long)data + 0x858);
      if (100000 < *(long *)((long)data + 0x858)) {
        return 1;
      }
      uVar2 = write(*(int *)((long)data + 0x860),buf,(long)len);
      _lws_log(8,"%s: write %d says %d\n","file_upload_cb",(ulong)(uint)len,uVar2 & 0xffffffff);
    }
    if (state != LWS_UFS_CONTENT) {
      close(*(int *)((long)data + 0x860));
      *(undefined4 *)((long)data + 0x860) = 0xffffffff;
    }
  }
  else if (state == LWS_UFS_OPEN) {
    lws_strncpy((char *)((long)data + 0x818),filename,0x40);
    iVar1 = lws_open("/tmp/post-file",0x242,0x180);
    *(int *)((long)data + 0x860) = iVar1;
  }
  return 0;
}

Assistant:

static int
file_upload_cb(void *data, const char *name, const char *filename,
	       char *buf, int len, enum lws_spa_fileupload_states state)
{
	struct per_session_data__post_demo *pss =
			(struct per_session_data__post_demo *)data;
#if !defined(LWS_WITH_ESP32)
	int n;

	(void)n;
#endif

	switch (state) {
	case LWS_UFS_OPEN:
		lws_strncpy(pss->filename, filename, sizeof(pss->filename));
		/* we get the original filename in @filename arg, but for
		 * simple demo use a fixed name so we don't have to deal with
		 * attacks  */
#if !defined(LWS_WITH_ESP32)
		pss->fd = (lws_filefd_type)(long long)lws_open("/tmp/post-file",
			       O_CREAT | O_TRUNC | O_RDWR, 0600);
#endif
		break;
	case LWS_UFS_FINAL_CONTENT:
	case LWS_UFS_CONTENT:
		if (len) {
			pss->file_length += len;

			/* if the file length is too big, drop it */
			if (pss->file_length > 100000)
				return 1;

#if !defined(LWS_WITH_ESP32)
			n = write((int)(long long)pss->fd, buf, len);
			lwsl_info("%s: write %d says %d\n", __func__, len, n);
#else
			lwsl_notice("%s: Received chunk size %d\n", __func__, len);
#endif
		}
		if (state == LWS_UFS_CONTENT)
			break;
#if !defined(LWS_WITH_ESP32)
		close((int)(long long)pss->fd);
		pss->fd = LWS_INVALID_FILE;
#endif
		break;
	case LWS_UFS_CLOSE:
		break;
	}

	return 0;
}